

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void mmm01_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  anon_union_40_5_5d684a24_for_MemoryMapState_3 *paVar1;
  u32 rom_offset;
  Mmm01 *mmm01;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  paVar1 = &(e->state).memory_map_state.field_3;
  if (addr >> 0xd == 0) {
    if ((e->cart_info->size & e->cart_info->size - 1) != 0) {
      __assert_fail("(e->cart_info->size & (e->cart_info->size - 1)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x61e,"void mmm01_write_rom(Emulator *, MaskedAddress, u8)");
    }
    set_cart_info(e,(u8)(((uint)(paVar1->mbc1).byte_2000_3fff << 0xe & (int)e->cart_info->size - 1U)
                        >> 0xf));
  }
  else if (addr >> 0xd == 1) {
    (paVar1->mbc1).byte_2000_3fff = value;
  }
  return;
}

Assistant:

static void mmm01_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  Mmm01* mmm01 = &MMAP_STATE.mmm01;
  switch (addr >> 13) {
    case 0: { /* 0000-1fff */
      /* ROM size should be power-of-two. */
      assert((e->cart_info->size & (e->cart_info->size - 1)) == 0);
      u32 rom_offset =
          (mmm01->byte_2000_3fff << ROM_BANK_SHIFT) & (e->cart_info->size - 1);
      set_cart_info(e, rom_offset >> CART_INFO_SHIFT);
      break;
    }
    case 1: /* 2000-3fff */
      mmm01->byte_2000_3fff = value;
      break;
  }
}